

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseScript(TidyDocImpl *doc,Node *script,GetTokenMode mode)

{
  Node *pNVar1;
  Node *node;
  GetTokenMode mode_local;
  Node *script_local;
  TidyDocImpl *doc_local;
  
  doc->lexer->parent = script;
  pNVar1 = prvTidyGetToken(doc,CdataContent);
  doc->lexer->parent = (Node *)0x0;
  if (pNVar1 == (Node *)0x0) {
    prvTidyReport(doc,script,(Node *)0x0,0x25a);
  }
  else {
    prvTidyInsertNodeAtEnd(script,pNVar1);
    pNVar1 = prvTidyGetToken(doc,IgnoreWhitespace);
    if ((((pNVar1 == (Node *)0x0) || (pNVar1->type != EndTag)) || (pNVar1->tag == (Dict *)0x0)) ||
       (pNVar1->tag->id != script->tag->id)) {
      prvTidyReport(doc,script,pNVar1,0x25a);
      if (pNVar1 != (Node *)0x0) {
        prvTidyUngetToken(doc);
      }
    }
    else {
      prvTidyFreeNode(doc,pNVar1);
    }
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseScript)( TidyDocImpl* doc, Node *script, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node = NULL;
#if defined(ENABLE_DEBUG_LOG)
    static int depth_parser = 0;
    static int count_parser = 0;
#endif
    
    DEBUG_LOG_ENTER_WITH_NODE(script);
    
    doc->lexer->parent = script;
    node = TY_(GetToken)(doc, CdataContent);
    doc->lexer->parent = NULL;

    if (node)
    {
        TY_(InsertNodeAtEnd)(script, node);
    }
    else
    {
        /* handle e.g. a document like "<script>" */
        TY_(Report)(doc, script, NULL, MISSING_ENDTAG_FOR);
        DEBUG_LOG_EXIT;
        return NULL;
    }

    node = TY_(GetToken)(doc, IgnoreWhitespace);
    DEBUG_LOG_GOT_TOKEN(node);

    if (!(node && node->type == EndTag && node->tag &&
        node->tag->id == script->tag->id))
    {
        TY_(Report)(doc, script, node, MISSING_ENDTAG_FOR);

        if (node)
            TY_(UngetToken)(doc);
    }
    else
    {
        TY_(FreeNode)(doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}